

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O1

TEXTURE_FORMAT Diligent::UnormFormatToSRGB(TEXTURE_FORMAT Fmt)

{
  undefined2 in_register_0000003a;
  
  if (CONCAT22(in_register_0000003a,Fmt) < 0x57) {
    if (CONCAT22(in_register_0000003a,Fmt) < 0x4a) {
      if (CONCAT22(in_register_0000003a,Fmt) == 0x1c) {
        return TEX_FORMAT_RGBA8_UNORM_SRGB;
      }
      if (CONCAT22(in_register_0000003a,Fmt) == 0x47) {
        return TEX_FORMAT_BC1_UNORM_SRGB;
      }
    }
    else {
      if (CONCAT22(in_register_0000003a,Fmt) == 0x4a) {
        return TEX_FORMAT_BC2_UNORM_SRGB;
      }
      if (CONCAT22(in_register_0000003a,Fmt) == 0x4d) {
        return TEX_FORMAT_BC3_UNORM_SRGB;
      }
    }
  }
  else {
    switch(CONCAT22(in_register_0000003a,Fmt)) {
    case 0x62:
      return TEX_FORMAT_BC7_UNORM_SRGB;
    case 99:
    case 0x65:
    case 0x67:
      break;
    case 100:
      return TEX_FORMAT_ETC2_RGB8_UNORM_SRGB;
    case 0x66:
      return TEX_FORMAT_ETC2_RGB8A1_UNORM_SRGB;
    case 0x68:
      return TEX_FORMAT_ETC2_RGBA8_UNORM_SRGB;
    default:
      if (CONCAT22(in_register_0000003a,Fmt) == 0x57) {
        return TEX_FORMAT_BGRA8_UNORM_SRGB;
      }
      if (CONCAT22(in_register_0000003a,Fmt) == 0x58) {
        return TEX_FORMAT_BGRX8_UNORM_SRGB;
      }
    }
  }
  return Fmt;
}

Assistant:

TEXTURE_FORMAT UnormFormatToSRGB(TEXTURE_FORMAT Fmt)
{
    static_assert(TEX_FORMAT_NUM_FORMATS == 106, "Please update the switch below to handle the new texture format, if needed");
    switch (Fmt)
    {
        case TEX_FORMAT_RGBA8_UNORM:
            return TEX_FORMAT_RGBA8_UNORM_SRGB;

        case TEX_FORMAT_BC1_UNORM:
            return TEX_FORMAT_BC1_UNORM_SRGB;

        case TEX_FORMAT_BC2_UNORM:
            return TEX_FORMAT_BC2_UNORM_SRGB;

        case TEX_FORMAT_BC3_UNORM:
            return TEX_FORMAT_BC3_UNORM_SRGB;

        case TEX_FORMAT_BGRA8_UNORM:
            return TEX_FORMAT_BGRA8_UNORM_SRGB;

        case TEX_FORMAT_BGRX8_UNORM:
            return TEX_FORMAT_BGRX8_UNORM_SRGB;

        case TEX_FORMAT_BC7_UNORM:
            return TEX_FORMAT_BC7_UNORM_SRGB;

        case TEX_FORMAT_ETC2_RGB8_UNORM:
            return TEX_FORMAT_ETC2_RGB8_UNORM_SRGB;

        case TEX_FORMAT_ETC2_RGB8A1_UNORM:
            return TEX_FORMAT_ETC2_RGB8A1_UNORM_SRGB;

        case TEX_FORMAT_ETC2_RGBA8_UNORM:
            return TEX_FORMAT_ETC2_RGBA8_UNORM_SRGB;

        default:
            return Fmt;
    }
}